

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lists.cc
# Opt level: O0

void __thiscall ListNodes<int_*>::~ListNodes(ListNodes<int_*> *this)

{
  shared_ptr<ListNodes<int_*>_> local_20;
  ListNodes<int_*> *local_10;
  ListNodes<int_*> *this_local;
  
  local_10 = this;
  std::shared_ptr<ListNodes<int_*>_>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<ListNodes<int_*>_>::operator=(&this->theNext,&local_20);
  std::shared_ptr<ListNodes<int_*>_>::~shared_ptr(&local_20);
  this->theItem = (int *)0x0;
  std::shared_ptr<ListNodes<int_*>_>::~shared_ptr(&this->theNext);
  return;
}

Assistant:

ListNodes<T>::~ListNodes() {
    theNext = nullptr;
    theItem = nullptr;
}